

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bblif.c
# Opt level: O0

void Bbl_ManPrintStats(Bbl_Man_t *p)

{
  int iVar1;
  bool bVar2;
  uint local_30;
  uint local_2c;
  int nObjs;
  int nNodes;
  int nFuncs;
  int h;
  Bbl_Fnc_t *pFnc;
  Bbl_Obj_t *pObj;
  Bbl_Man_t *p_local;
  
  nObjs = 0;
  local_2c = 0;
  local_30 = 0;
  nNodes = 0;
  while( true ) {
    bVar2 = false;
    if (nNodes < p->pObjs->nSize) {
      pFnc = (Bbl_Fnc_t *)Bbl_VecObj(p->pObjs,nNodes);
      bVar2 = (Bbl_Obj_t *)pFnc != (Bbl_Obj_t *)0x0;
    }
    if (!bVar2) break;
    local_30 = local_30 + 1;
    iVar1 = Bbl_ObjIsNode((Bbl_Obj_t *)pFnc);
    local_2c = iVar1 + local_2c;
    iVar1 = Bbl_ObjSize((Bbl_Obj_t *)pFnc);
    nNodes = iVar1 + nNodes;
  }
  nNodes = 0;
  while( true ) {
    bVar2 = false;
    if (nNodes < p->pFncs->nSize) {
      _nFuncs = Bbl_VecFnc(p->pFncs,nNodes);
      bVar2 = _nFuncs != (Bbl_Fnc_t *)0x0;
    }
    if (!bVar2) break;
    nObjs = nObjs + 1;
    iVar1 = Bbl_FncSize(_nFuncs);
    nNodes = iVar1 + nNodes;
  }
  printf("Total objects = %7d.  Total nodes = %7d. Unique functions = %7d.\n",(ulong)local_30,
         (ulong)local_2c,(ulong)(uint)nObjs);
  iVar1 = Vec_StrSize(p->pName);
  printf("Name manager = %5.2f MB\n",((double)iVar1 * 1.0) / 1048576.0);
  iVar1 = Vec_StrSize(p->pObjs);
  printf("Objs manager = %5.2f MB\n",((double)iVar1 * 1.0) / 1048576.0);
  iVar1 = Vec_StrSize(p->pFncs);
  printf("Fncs manager = %5.2f MB\n",((double)iVar1 * 1.0) / 1048576.0);
  return;
}

Assistant:

void Bbl_ManPrintStats( Bbl_Man_t * p )
{
    Bbl_Obj_t * pObj;
    Bbl_Fnc_t * pFnc;
    int h, nFuncs = 0, nNodes = 0, nObjs = 0;
    Bbl_ManForEachObj_int( p->pObjs, pObj, h )
        nObjs++, nNodes += Bbl_ObjIsNode(pObj);
    Bbl_ManForEachFnc_int( p->pFncs, pFnc, h )
        nFuncs++;
    printf( "Total objects = %7d.  Total nodes = %7d. Unique functions = %7d.\n", nObjs, nNodes, nFuncs );
    printf( "Name manager = %5.2f MB\n", 1.0*Vec_StrSize(p->pName)/(1 << 20) );
    printf( "Objs manager = %5.2f MB\n", 1.0*Vec_StrSize(p->pObjs)/(1 << 20) );
    printf( "Fncs manager = %5.2f MB\n", 1.0*Vec_StrSize(p->pFncs)/(1 << 20) );
}